

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

string * __thiscall
helics::CommonCore::getSourceTargets_abi_cxx11_(CommonCore *this,InterfaceHandle handle)

{
  char cVar1;
  unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *puVar2;
  FederateState *pFVar3;
  InputInfo *this_00;
  string *psVar4;
  EndpointInfo *this_01;
  
  puVar2 = getHandleInfo(this,handle);
  if (puVar2 != (unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *)0x0)
  {
    cVar1 = *(char *)((long)&puVar2[1]._M_t.
                             super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                             .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl + 4)
    ;
    if ((cVar1 == 'e') || (cVar1 == 's')) {
      pFVar3 = getFederateAt(this,(LocalFederateId)
                                  *(BaseType *)
                                   &puVar2[1]._M_t.
                                    super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                                    .super__Head_base<0UL,_helics::BrokerObject_*,_false>.
                                    _M_head_impl);
      this_01 = InterfaceInfo::getEndpoint(&pFVar3->interfaceInformation,handle);
      if (this_01 != (EndpointInfo *)0x0) {
        psVar4 = EndpointInfo::getSourceTargets_abi_cxx11_(this_01);
        return psVar4;
      }
    }
    else if (cVar1 == 'i') {
      pFVar3 = getFederateAt(this,(LocalFederateId)
                                  *(BaseType *)
                                   &puVar2[1]._M_t.
                                    super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                                    .super__Head_base<0UL,_helics::BrokerObject_*,_false>.
                                    _M_head_impl);
      this_00 = InterfaceInfo::getInput(&pFVar3->interfaceInformation,handle);
      if (this_00 != (InputInfo *)0x0) {
        psVar4 = InputInfo::getTargets_abi_cxx11_(this_00);
        return psVar4;
      }
    }
  }
  return (string *)&gEmptyString_abi_cxx11_;
}

Assistant:

const std::string& CommonCore::getSourceTargets(InterfaceHandle handle) const
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo != nullptr) {
        switch (handleInfo->handleType) {
            case InterfaceType::INPUT: {
                auto* fed = getFederateAt(handleInfo->local_fed_id);
                auto* inpInfo = fed->interfaces().getInput(handle);
                if (inpInfo != nullptr) {
                    return inpInfo->getTargets();
                }
                break;
            }
            case InterfaceType::PUBLICATION:
                return gEmptyString;
            case InterfaceType::ENDPOINT:
            case InterfaceType::SINK: {
                auto* fed = getFederateAt(handleInfo->local_fed_id);
                auto* eptInfo = fed->interfaces().getEndpoint(handle);
                if (eptInfo != nullptr) {
                    return eptInfo->getSourceTargets();
                }
                break;
            }
            case InterfaceType::FILTER: {
                break;
            }
            default:
                return gEmptyString;
        }
    }
    return gEmptyString;
}